

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O1

reference __thiscall
QVLABase<QByteArrayView>::emplace_back_impl<QByteArrayView_const&>
          (QVLABase<QByteArrayView> *this,qsizetype prealloc,void *array,QByteArrayView *args)

{
  qsizetype *pqVar1;
  void *pvVar2;
  storage_type *psVar3;
  long lVar4;
  long aalloc;
  
  lVar4 = (this->super_QVLABaseBase).s;
  if (lVar4 == (this->super_QVLABaseBase).a) {
    aalloc = lVar4 + 1;
    if (lVar4 + 1 < lVar4 * 2) {
      aalloc = lVar4 * 2;
    }
    reallocate_impl(this,prealloc,array,lVar4,aalloc);
  }
  pvVar2 = (this->super_QVLABaseBase).ptr;
  lVar4 = (this->super_QVLABaseBase).s * 0x10;
  psVar3 = args->m_data;
  pqVar1 = (qsizetype *)((long)pvVar2 + lVar4);
  *pqVar1 = args->m_size;
  pqVar1[1] = (qsizetype)psVar3;
  pqVar1 = &(this->super_QVLABaseBase).s;
  *pqVar1 = *pqVar1 + 1;
  return (reference)((long)pvVar2 + lVar4);
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }